

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.cpp
# Opt level: O1

void NativeCodeData::AddFixupEntryForPointerArray(void *startAddress,DataChunk *chunkList)

{
  void *data;
  code *pcVar1;
  DataChunk *pDVar2;
  bool bVar3;
  DataChunk *pDVar4;
  undefined4 *puVar5;
  DataChunk *pDVar6;
  HANDLE hHeap;
  NativeDataFixupEntry *pNVar7;
  DataChunk *pDVar8;
  ulong uVar9;
  
  pDVar4 = GetDataChunk(startAddress);
  if ((pDVar4->len & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x61,"(chunk->len % sizeof(void*) == 0)","chunk->len % sizeof(void*) == 0");
    if (!bVar3) {
LAB_005fb85e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (7 < pDVar4->len) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar9 = 0;
    do {
      data = *(void **)((long)startAddress + uVar9 * 8);
      if (data != (void *)0x0) {
        pDVar6 = GetDataChunk(data);
        pDVar2 = chunkList;
        if (chunkList == (DataChunk *)0x0) {
LAB_005fb77e:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                             ,0x76,"(foundTargetChunk)",
                             "current pointer is not allocated with NativeCodeData allocator?");
          if (!bVar3) goto LAB_005fb85e;
          *puVar5 = 0;
        }
        else {
          do {
            pDVar8 = pDVar2;
            if (pDVar8 == pDVar6) break;
            pDVar2 = pDVar8->next;
          } while (pDVar8->next != (DataChunk *)0x0);
          if (pDVar8 != pDVar6) goto LAB_005fb77e;
        }
        hHeap = GetProcessHeap();
        pNVar7 = (NativeDataFixupEntry *)HeapAlloc(hHeap,0,0x10);
        if (pNVar7 == (NativeDataFixupEntry *)0x0) {
          Js::Throw::OutOfMemory();
        }
        pNVar7->addrOffset = (int)uVar9 * 8;
        pNVar7->targetTotalOffset = pDVar6->offset;
        pNVar7->next = pDVar4->fixupList;
        pDVar4->fixupList = pNVar7;
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,NativeCodeDataPhase);
        if (bVar3) {
          Output::Print(L"NativeCodeData Add Fixup: %p[%d](+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n",
                        startAddress,uVar9 & 0xffffffff,(ulong)pNVar7->addrOffset,pDVar4,data,pDVar6
                        ,pDVar4->dataType);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < pDVar4->len >> 3);
  }
  return;
}

Assistant:

void
NativeCodeData::AddFixupEntryForPointerArray(void* startAddress, DataChunk * chunkList)
{
    DataChunk* chunk = NativeCodeData::GetDataChunk(startAddress);
    Assert(chunk->len % sizeof(void*) == 0);
    for (unsigned int i = 0; i < chunk->len / sizeof(void*); i++)
    {
        size_t offset = i * sizeof(void*);
        void* targetAddr = *(void**)((char*)startAddress + offset);

        if (targetAddr == nullptr)
        {
            continue;
        }

        DataChunk* targetChunk = NativeCodeData::GetDataChunk(targetAddr);

#if DBG
        bool foundTargetChunk = false;
        DataChunk* chunk1 = chunkList;
        while (chunk1 && !foundTargetChunk)
        {
            foundTargetChunk = (chunk1 == targetChunk);
            chunk1 = chunk1->next;
        }
        AssertMsg(foundTargetChunk, "current pointer is not allocated with NativeCodeData allocator?"); // change to valid check instead of assertion?
#endif

        NativeDataFixupEntry* entry = (NativeDataFixupEntry*)midl_user_allocate(sizeof(NativeDataFixupEntry));
        if (!entry)
        {
            Js::Throw::OutOfMemory();
        }
        __analysis_assume(entry);
        entry->addrOffset = (unsigned int)offset;
        entry->targetTotalOffset = targetChunk->offset;
        entry->next = chunk->fixupList;
        chunk->fixupList = entry;

#if DBG
        if (PHASE_TRACE1(Js::NativeCodeDataPhase))
        {
            Output::Print(_u("NativeCodeData Add Fixup: %p[%d](+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n"),
                startAddress, i, entry->addrOffset, (void*)chunk, targetAddr, (void*)targetChunk, chunk->dataType);
        }
#endif
    }
}